

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
::alloc<>(allocator_type<cs_impl::any::holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
          *this)

{
  _Map_pointer ppaVar1;
  __int_type_conflict _Var2;
  holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *phVar3;
  holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *in_RDI;
  new_allocator<cs_impl::any::holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_>_>
  *unaff_retaddr;
  holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *ptr;
  void *pvVar4;
  
  pvVar4 = (void *)0x0;
  phVar3 = in_RDI;
  if (in_RDI[5].mDat.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node != (_Map_pointer)0x0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDI);
    if (_Var2 == 0) {
      ppaVar1 = in_RDI[5].mDat.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node;
      in_RDI[5].mDat.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node = (_Map_pointer)((long)ppaVar1 + -1);
      phVar3 = *(holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> **)
                ((long)in_RDI + (long)ppaVar1 * 8 + -8);
      goto LAB_0020214a;
    }
  }
  phVar3 = __gnu_cxx::
           new_allocator<cs_impl::any::holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_>_>
           ::allocate(unaff_retaddr,(size_type)phVar3,pvVar4);
LAB_0020214a:
  __gnu_cxx::
  new_allocator<cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>>::
  construct<cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>>
            ((new_allocator<cs_impl::any::holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_>_>
              *)phVar3,in_RDI);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}